

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_count.cpp
# Opt level: O2

AggregateFunction * duckdb::RegrCountFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_R8;
  LogicalType local_60;
  LogicalType local_48;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd0,DOUBLE);
  LogicalType::LogicalType(&local_48,DOUBLE);
  LogicalType::LogicalType(&local_60,UINTEGER);
  AggregateFunction::
  BinaryAggregate<unsigned_long,double,double,unsigned_int,duckdb::RegrCountFunction,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffd0,&local_48,&local_60,in_R8);
  LogicalType::~LogicalType(&local_60);
  LogicalType::~LogicalType(&local_48);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd0);
  ::std::__cxx11::string::assign
            ((char *)&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.super_Function.name);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  return in_RDI;
}

Assistant:

AggregateFunction RegrCountFun::GetFunction() {
	auto regr_count = AggregateFunction::BinaryAggregate<size_t, double, double, uint32_t, RegrCountFunction>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::UINTEGER);
	regr_count.name = "regr_count";
	regr_count.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return regr_count;
}